

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_l2_norm_impl(ggml_context *ctx,ggml_tensor *a,float eps,_Bool inplace)

{
  ggml_tensor *tensor;
  byte in_DL;
  ggml_tensor *in_RSI;
  float in_XMM0_Da;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffd8;
  ggml_context *in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe8;
  
  if ((in_DL & 1) == 0) {
    tensor = ggml_dup_tensor(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    tensor = ggml_view_tensor((ggml_context *)in_RSI,
                              (ggml_tensor *)
                              (CONCAT44(in_XMM0_Da,CONCAT13(in_DL,in_stack_ffffffffffffffe8)) &
                              0xffffffff01ffffff));
  }
  ggml_set_op_params_f32(tensor,0,in_XMM0_Da);
  tensor->op = GGML_OP_L2_NORM;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_l2_norm_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        float                 eps,
        bool                  inplace) {
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    ggml_set_op_params_f32(result, 0, eps);

    result->op     = GGML_OP_L2_NORM;
    result->src[0] = a;

    return result;
}